

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_promise.cpp
# Opt level: O2

void test(void)

{
  uint __line;
  char *__assertion;
  promise<int> p;
  future<int> f;
  future_error e;
  
  std::make_shared<std::experimental::v1::detail::asynchronous_state<int>>();
  std::experimental::v1::promise<int>::get_future(&f,&p);
  if (f.variant_.index_ == 0) {
    f.variant_.
    super_variant_storage<std::experimental::v1::detail::async_future<int>,_std::experimental::v1::detail::made_ready_future<int>_>
    .storage_._32_4_ =
         ZEXT14(f.variant_.
                super_variant_storage<std::experimental::v1::detail::async_future<int>,_std::experimental::v1::detail::made_ready_future<int>_>
                .storage_._0_8_ != 0);
  }
  if ((f.variant_.
       super_variant_storage<std::experimental::v1::detail::async_future<int>,_std::experimental::v1::detail::made_ready_future<int>_>
       .storage_._32_4_ & 1) == 0) {
    __assertion = "f.valid()";
    __line = 0xd;
  }
  else {
    std::experimental::v1::promise<int>::get_future((future<int> *)&e,&p);
    __assertion = "0";
    __line = 0x12;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_promise.cpp"
                ,__line,"void test()");
}

Assistant:

void test()
{
  {
    // test non-void get_future
    std::experimental::promise<int> p;

    std::experimental::future<int> f = p.get_future();

    assert(f.valid());

    try
    {
      std::experimental::future<int> f = p.get_future();
      assert(0);
    }
    catch(std::future_error e)
    {
      assert(e.code() == std::future_errc::future_already_retrieved);
    }
    catch(...)
    {
      assert(0);
    }
  }

  {
    // test void get_future
    std::experimental::promise<void> p;

    std::experimental::future<void> f = p.get_future();

    assert(f.valid());

    try
    {
      std::experimental::future<void> f = p.get_future();
      assert(0);
    }
    catch(std::future_error e)
    {
      assert(e.code() == std::future_errc::future_already_retrieved);
    }
    catch(...)
    {
      assert(0);
    }
  }

  {
    // test non-void set_value() / .get()
    std::experimental::promise<int> p;

    int expected_result = 13;
    p.set_value(expected_result);

    int result = p.get_future().get();

    assert(expected_result == result);
  }

  {
    // test void set_value() / .get();
    std::experimental::promise<void> p;

    p.set_value();

    p.get_future().get();
  }

  {
    // test non-void superfluous set_value()
    std::experimental::promise<int> p;

    p.set_value(13);

    try
    {
      // calling set_value() again should throw promise_already_satisfied
      p.set_value(13);
      assert(0);
    }
    catch(std::future_error e)
    {
      assert(e.code() == std::future_errc::promise_already_satisfied);
    }
    catch(...)
    {
      assert(0);
    }
  }

  {
    // test void superfluous set_value()
    std::experimental::promise<void> p;

    p.set_value();

    try
    {
      // calling set_value() again should throw promise_already_satisfied
      p.set_value();
      assert(0);
    }
    catch(std::future_error e)
    {
      assert(e.code() == std::future_errc::promise_already_satisfied);
    }
    catch(...)
    {
      assert(0);
    }
  }
}